

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint lodepng_huffman_code_lengths(uint *lengths,uint *frequencies,size_t numcodes,uint maxbitlen)

{
  BPMNode *pBVar1;
  size_t __size;
  uint uVar2;
  BPMNode *pBVar3;
  BPMNode *pBVar4;
  BPMNode *pBVar5;
  undefined4 uVar6;
  bool bVar7;
  int iVar8;
  BPMNode *leaves;
  ulong uVar9;
  BPMNode *pBVar10;
  BPMNode **ppBVar11;
  BPMNode **ppBVar12;
  bool bVar13;
  uint uVar14;
  ulong uVar15;
  BPMNode *pBVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  undefined1 auVar25 [16];
  BPMLists lists;
  BPMLists local_88;
  size_t local_50;
  uint *local_48;
  BPMNode *local_40;
  BPMNode *local_38;
  
  if ((uint)(1 << ((byte)maxbitlen & 0x1f)) < (uint)numcodes || numcodes == 0) {
    return 0x50;
  }
  leaves = (BPMNode *)malloc(numcodes * 0x18);
  if (leaves == (BPMNode *)0x0) {
    return 0x53;
  }
  if (numcodes == 0) {
    uVar20 = 0;
  }
  else {
    uVar9 = 0;
    uVar20 = 0;
    do {
      if (frequencies[uVar9] != 0) {
        leaves[uVar20].weight = frequencies[uVar9];
        leaves[uVar20].index = (uint)uVar9;
        uVar20 = uVar20 + 1;
      }
      uVar9 = uVar9 + 1;
    } while ((uVar9 & 0xffffffff) != numcodes);
  }
  if (numcodes != 0) {
    uVar9 = 0;
    do {
      lengths[uVar9] = 0;
      uVar9 = uVar9 + 1;
    } while ((uVar9 & 0xffffffff) != numcodes);
  }
  if (uVar20 == 1) {
    uVar14 = leaves->index;
    lengths[uVar14] = 1;
    lengths[(ulong)uVar14 == 0] = 1;
  }
  else {
    if (uVar20 != 0) {
      __size = uVar20 * 0x18;
      local_48 = lengths;
      pBVar10 = (BPMNode *)malloc(__size);
      if (1 < uVar20) {
        uVar9 = 1;
        bVar7 = false;
        do {
          bVar13 = bVar7;
          pBVar16 = leaves;
          pBVar4 = pBVar10;
          if (!bVar13) {
            pBVar16 = pBVar10;
            pBVar4 = leaves;
          }
          uVar22 = uVar9 * 2;
          uVar18 = 0;
          do {
            uVar23 = uVar18 + uVar9;
            if (uVar20 <= uVar18 + uVar9) {
              uVar23 = uVar20;
            }
            uVar17 = uVar18 + uVar22;
            pBVar5 = pBVar16;
            uVar19 = uVar18;
            uVar21 = uVar23;
            uVar24 = uVar20;
            if (uVar17 < uVar20) {
              uVar24 = uVar17;
            }
            for (; uVar18 < uVar24; uVar18 = uVar18 + 1) {
              if ((uVar19 < uVar23) &&
                 ((uVar24 <= uVar21 || (pBVar4[uVar19].weight <= pBVar4[uVar21].weight)))) {
                uVar15 = uVar19 + 1;
              }
              else {
                uVar15 = uVar19;
                uVar19 = uVar21;
                uVar21 = uVar21 + 1;
              }
              uVar6 = *(undefined4 *)&pBVar4[uVar19].field_0x14;
              pBVar5->in_use = pBVar4[uVar19].in_use;
              *(undefined4 *)&pBVar5->field_0x14 = uVar6;
              pBVar1 = pBVar4 + uVar19;
              uVar14 = pBVar1->index;
              pBVar3 = pBVar1->tail;
              pBVar5->weight = pBVar1->weight;
              pBVar5->index = uVar14;
              pBVar5->tail = pBVar3;
              pBVar5 = pBVar5 + 1;
              uVar19 = uVar15;
            }
            pBVar16 = pBVar16 + uVar9 * 2;
            uVar18 = uVar17;
          } while (uVar17 < uVar20);
          uVar9 = uVar22;
          bVar7 = (bool)(bVar13 ^ 1);
        } while (uVar22 < uVar20);
        local_50 = __size;
        local_40 = pBVar10;
        local_38 = leaves;
        if (!bVar13) {
          memcpy(leaves,pBVar10,__size);
        }
      }
      free(pBVar10);
      uVar2 = (maxbitlen + 1) * maxbitlen * 2;
      local_88.nextfree = 0;
      local_88.memsize = uVar2;
      local_88.numfree = uVar2;
      local_88.listsize = maxbitlen;
      pBVar10 = (BPMNode *)malloc((ulong)uVar2 * 0x18);
      local_88.memory = pBVar10;
      ppBVar11 = (BPMNode **)malloc((ulong)uVar2 * 8);
      local_88.freelist = ppBVar11;
      ppBVar12 = (BPMNode **)malloc((ulong)maxbitlen << 3);
      local_88.chains0 = ppBVar12;
      local_88.chains1 = (BPMNode **)malloc((ulong)maxbitlen << 3);
      auVar25._0_4_ = -(uint)((int)((ulong)pBVar10 >> 0x20) == 0 && (int)pBVar10 == 0);
      auVar25._4_4_ = -(uint)((int)ppBVar11 == 0 && (int)((ulong)ppBVar11 >> 0x20) == 0);
      auVar25._8_4_ = -(uint)((int)((ulong)ppBVar12 >> 0x20) == 0 && (int)ppBVar12 == 0);
      auVar25._12_4_ =
           -(uint)((int)local_88.chains1 == 0 && (int)((ulong)local_88.chains1 >> 0x20) == 0);
      iVar8 = movmskps((int)local_88.chains1,auVar25);
      uVar14 = 0x53;
      if (iVar8 == 0) {
        if (uVar2 != 0) {
          uVar9 = 0;
          do {
            local_88.freelist[uVar9] = local_88.memory + uVar9;
            uVar9 = uVar9 + 1;
          } while (uVar9 != uVar2);
        }
        bpmnode_create(&local_88,leaves->weight,1,(BPMNode *)0x0);
        bpmnode_create(&local_88,leaves[1].weight,2,(BPMNode *)0x0);
        if ((ulong)local_88.listsize != 0) {
          uVar9 = 0;
          do {
            local_88.chains0[uVar9] = local_88.memory;
            local_88.chains1[uVar9] = local_88.memory + 1;
            uVar9 = uVar9 + 1;
          } while (local_88.listsize != uVar9);
        }
        uVar9 = uVar20 * 2 - 2;
        if (uVar9 != 2) {
          uVar22 = 2;
          do {
            boundaryPM(&local_88,leaves,uVar20,maxbitlen - 1,(int)uVar22);
            uVar22 = (ulong)((int)uVar22 + 1);
          } while (uVar9 != uVar22);
        }
        for (pBVar10 = local_88.chains1[maxbitlen - 1]; uVar14 = 0, pBVar10 != (BPMNode *)0x0;
            pBVar10 = pBVar10->tail) {
          if (pBVar10->index != 0) {
            uVar20 = 0;
            do {
              local_48[leaves[uVar20].index] = local_48[leaves[uVar20].index] + 1;
              uVar14 = (int)uVar20 + 1;
              uVar20 = (ulong)uVar14;
            } while (uVar14 != pBVar10->index);
          }
        }
      }
      free(local_88.memory);
      free(local_88.freelist);
      free(local_88.chains0);
      free(local_88.chains1);
      goto LAB_00103bee;
    }
    lengths[0] = 1;
    lengths[1] = 1;
  }
  uVar14 = 0;
LAB_00103bee:
  free(leaves);
  return uVar14;
}

Assistant:

unsigned lodepng_huffman_code_lengths(unsigned* lengths, const unsigned* frequencies,
                                      size_t numcodes, unsigned maxbitlen) {
  unsigned error = 0;
  unsigned i;
  size_t numpresent = 0; /*number of symbols with non-zero frequency*/
  BPMNode* leaves; /*the symbols, only those with > 0 frequency*/

  if(numcodes == 0) return 80; /*error: a tree of 0 symbols is not supposed to be made*/
  if((1u << maxbitlen) < (unsigned)numcodes) return 80; /*error: represent all symbols*/

  leaves = (BPMNode*)lodepng_malloc(numcodes * sizeof(*leaves));
  if(!leaves) return 83; /*alloc fail*/

  for(i = 0; i != numcodes; ++i) {
    if(frequencies[i] > 0) {
      leaves[numpresent].weight = (int)frequencies[i];
      leaves[numpresent].index = i;
      ++numpresent;
    }
  }

  for(i = 0; i != numcodes; ++i) lengths[i] = 0;

  /*ensure at least two present symbols. There should be at least one symbol
  according to RFC 1951 section 3.2.7. Some decoders incorrectly require two. To
  make these work as well ensure there are at least two symbols. The
  Package-Merge code below also doesn't work correctly if there's only one
  symbol, it'd give it the theoritical 0 bits but in practice zlib wants 1 bit*/
  if(numpresent == 0) {
    lengths[0] = lengths[1] = 1; /*note that for RFC 1951 section 3.2.7, only lengths[0] = 1 is needed*/
  } else if(numpresent == 1) {
    lengths[leaves[0].index] = 1;
    lengths[leaves[0].index == 0 ? 1 : 0] = 1;
  } else {
    BPMLists lists;
    BPMNode* node;

    bpmnode_sort(leaves, numpresent);

    lists.listsize = maxbitlen;
    lists.memsize = 2 * maxbitlen * (maxbitlen + 1);
    lists.nextfree = 0;
    lists.numfree = lists.memsize;
    lists.memory = (BPMNode*)lodepng_malloc(lists.memsize * sizeof(*lists.memory));
    lists.freelist = (BPMNode**)lodepng_malloc(lists.memsize * sizeof(BPMNode*));
    lists.chains0 = (BPMNode**)lodepng_malloc(lists.listsize * sizeof(BPMNode*));
    lists.chains1 = (BPMNode**)lodepng_malloc(lists.listsize * sizeof(BPMNode*));
    if(!lists.memory || !lists.freelist || !lists.chains0 || !lists.chains1) error = 83; /*alloc fail*/

    if(!error) {
      for(i = 0; i != lists.memsize; ++i) lists.freelist[i] = &lists.memory[i];

      bpmnode_create(&lists, leaves[0].weight, 1, 0);
      bpmnode_create(&lists, leaves[1].weight, 2, 0);

      for(i = 0; i != lists.listsize; ++i) {
        lists.chains0[i] = &lists.memory[0];
        lists.chains1[i] = &lists.memory[1];
      }

      /*each boundaryPM call adds one chain to the last list, and we need 2 * numpresent - 2 chains.*/
      for(i = 2; i != 2 * numpresent - 2; ++i) boundaryPM(&lists, leaves, numpresent, (int)maxbitlen - 1, (int)i);

      for(node = lists.chains1[maxbitlen - 1]; node; node = node->tail) {
        for(i = 0; i != node->index; ++i) ++lengths[leaves[i].index];
      }
    }

    lodepng_free(lists.memory);
    lodepng_free(lists.freelist);
    lodepng_free(lists.chains0);
    lodepng_free(lists.chains1);
  }

  lodepng_free(leaves);
  return error;
}